

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O0

bool __thiscall
QMimeDatabasePrivate::inherits(QMimeDatabasePrivate *this,QString *mime,QString *parent)

{
  bool bVar1;
  undefined1 uVar2;
  QMimeDatabasePrivate *this_00;
  const_iterator o;
  long in_FS_OFFSET;
  QString *par;
  QStringList *__range2;
  QString resolvedPar;
  const_iterator __end2;
  const_iterator __begin2;
  QStringList parentList;
  QString mimeName;
  stack<QString,_QList<QString>_> toCheck;
  QString resolvedParent;
  QDuplicateTracker<QString,_32UL> seen;
  value_type *in_stack_fffffffffffff838;
  QDuplicateTracker<QString,_32UL> *in_stack_fffffffffffff840;
  undefined6 in_stack_fffffffffffff848;
  undefined1 in_stack_fffffffffffff84e;
  undefined1 in_stack_fffffffffffff84f;
  undefined7 in_stack_fffffffffffff858;
  undefined1 in_stack_fffffffffffff85f;
  QMimeDatabasePrivate *in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff870;
  undefined1 in_stack_fffffffffffff877;
  QString *in_stack_fffffffffffff888;
  QMimeDatabasePrivate *in_stack_fffffffffffff890;
  bool local_739;
  const_iterator local_710;
  QMimeDatabasePrivate local_708;
  undefined1 *puStack_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6a8;
  undefined1 *puStack_6a0;
  undefined1 *local_698;
  undefined1 local_690 [1672];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_698 = &DAT_aaaaaaaaaaaaaaaa;
  local_6a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_6a0 = &DAT_aaaaaaaaaaaaaaaa;
  resolveAlias(in_stack_fffffffffffff860,
               (QString *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858));
  memcpy(local_690,&DAT_00a1a4e8,0x688);
  QDuplicateTracker<QString,_32UL>::QDuplicateTracker
            ((QDuplicateTracker<QString,_32UL> *)
             CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
  local_708.mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p = (QBasicMutex)&DAT_aaaaaaaaaaaaaaaa;
  puStack_6c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_6b8 = &DAT_aaaaaaaaaaaaaaaa;
  std::stack<QString,QList<QString>>::stack<QList<QString>,void>
            ((stack<QString,_QList<QString>_> *)in_stack_fffffffffffff840);
  std::stack<QString,_QList<QString>_>::push
            ((stack<QString,_QList<QString>_> *)in_stack_fffffffffffff840,in_stack_fffffffffffff838)
  ;
  do {
    bVar1 = std::stack<QString,_QList<QString>_>::empty((stack<QString,_QList<QString>_> *)0x8e48fb)
    ;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_739 = false;
LAB_008e4c1c:
      std::stack<QString,_QList<QString>_>::~stack((stack<QString,_QList<QString>_> *)0x8e4c29);
      QDuplicateTracker<QString,_32UL>::~QDuplicateTracker(in_stack_fffffffffffff840);
      QString::~QString((QString *)0x8e4c43);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_739;
      }
      __stack_chk_fail();
    }
    std::stack<QString,_QList<QString>_>::top
              ((stack<QString,_QList<QString>_> *)in_stack_fffffffffffff840);
    bVar1 = ::operator==((QString *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
    if (bVar1) {
      local_739 = true;
      goto LAB_008e4c1c;
    }
    local_708.m_providers.
    super__Vector_base<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_aaaaaaaaaaaaaaaa;
    local_708.m_providers.
    super__Vector_base<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_aaaaaaaaaaaaaaaa;
    local_708.m_lastCheck.t1 = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QMimeDatabasePrivate *)
              std::stack<QString,_QList<QString>_>::top
                        ((stack<QString,_QList<QString>_> *)in_stack_fffffffffffff840);
    QString::QString((QString *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
    std::stack<QString,_QList<QString>_>::pop
              ((stack<QString,_QList<QString>_> *)in_stack_fffffffffffff840);
    local_708.m_defaultMimeType.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_708.m_defaultMimeType.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_708.m_defaultMimeType.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    parents(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    in_stack_fffffffffffff890 = &local_708;
    local_710.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_710 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffff840);
    o = QList<QString>::end((QList<QString> *)in_stack_fffffffffffff840);
    while( true ) {
      uVar2 = QList<QString>::const_iterator::operator!=(&local_710,o);
      if (!(bool)uVar2) break;
      in_stack_fffffffffffff888 = QList<QString>::const_iterator::operator*(&local_710);
      resolveAlias(this_00,(QString *)CONCAT17(uVar2,in_stack_fffffffffffff858));
      in_stack_fffffffffffff84f =
           QDuplicateTracker<QString,_32UL>::hasSeen
                     ((QDuplicateTracker<QString,_32UL> *)
                      CONCAT17(in_stack_fffffffffffff84f,
                               CONCAT16(in_stack_fffffffffffff84e,in_stack_fffffffffffff848)),
                      (QString *)in_stack_fffffffffffff840);
      if (!(bool)in_stack_fffffffffffff84f) {
        std::stack<QString,_QList<QString>_>::push
                  ((stack<QString,_QList<QString>_> *)in_stack_fffffffffffff840,
                   in_stack_fffffffffffff838);
      }
      QString::~QString((QString *)0x8e4bbd);
      QList<QString>::const_iterator::operator++(&local_710);
    }
    QList<QString>::~QList((QList<QString> *)0x8e4bde);
    QString::~QString((QString *)0x8e4beb);
  } while( true );
}

Assistant:

bool QMimeDatabasePrivate::inherits(const QString &mime, const QString &parent)
{
    const QString resolvedParent = resolveAlias(parent);
    QDuplicateTracker<QString> seen;
    std::stack<QString, QStringList> toCheck;
    toCheck.push(mime);
    while (!toCheck.empty()) {
        if (toCheck.top() == resolvedParent)
            return true;
        const QString mimeName = toCheck.top();
        toCheck.pop();
        const auto parentList = parents(mimeName);
        for (const QString &par : parentList) {
            const QString resolvedPar = resolveAlias(par);
            if (!seen.hasSeen(resolvedPar))
                toCheck.push(resolvedPar);
        }
    }
    return false;
}